

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Finite * __thiscall Matrix<Finite>::det(Matrix<Finite> *this)

{
  uint uVar1;
  undefined8 uVar2;
  Finite *in_RSI;
  Matrix<Finite> *in_RDI;
  uint i;
  Matrix<Finite> tmp;
  Finite *ans;
  Matrix<Finite> *in_stack_00000160;
  Matrix<Finite> *in_stack_00000168;
  char *in_stack_ffffffffffffff88;
  matrix_error *in_stack_ffffffffffffff90;
  Matrix<Finite> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (*(int *)((long)&(in_RSI->val).digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) !=
      *(int *)&(in_RSI->val).digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start) {
    uVar2 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __cxa_throw(uVar2,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  Matrix(in_RDI,in_RDI);
  uVar1 = gauss(in_stack_00000168,in_stack_00000160);
  if (uVar1 == *(uint *)((long)&(in_RSI->val).digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4)) {
    Finite::Finite((Finite *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_RSI >> 0x20));
    for (uVar1 = 0;
        uVar1 < (uint)(*(int *)((long)&(in_RSI->val).digits.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4) *
                      *(int *)((long)&(in_RSI->val).digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 4));
        uVar1 = *(int *)((long)&(in_RSI->val).digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4) + 1 + uVar1) {
      Finite::operator*=((Finite *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_RSI);
    }
  }
  else {
    Finite::Finite((Finite *)0x160534);
  }
  ~Matrix(in_stack_ffffffffffffffa0);
  return (Finite *)in_RDI;
}

Assistant:

const Field Matrix<Field>::det() const
{
    if(N != M)
        throw matrix_error("Trying to calculate determinant of a non-square matrix");
    Matrix tmp(*this);
    if(tmp.gauss() != N)
        return Field();
    Field ans = 1;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans *= tmp.arr[i];
    }
    return ans;
}